

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.h
# Opt level: O0

string * __thiscall
sentencepiece::SentencePieceProcessor::DecodeIds_abi_cxx11_
          (string *__return_storage_ptr__,SentencePieceProcessor *this,
          vector<int,_std::allocator<int>_> *ids)

{
  Status local_30;
  Status status;
  vector<int,_std::allocator<int>_> *ids_local;
  SentencePieceProcessor *this_local;
  string *output;
  
  status.rep_._M_t.
  super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  ._M_t.
  super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
  .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  (*this->_vptr_SentencePieceProcessor[0x11])(&local_30,this,ids,__return_storage_ptr__);
  util::Status::ok(&local_30);
  status.rep_._M_t.
  super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  ._M_t.
  super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
  .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl._7_1_ = 1;
  util::Status::~Status(&local_30);
  if ((status.rep_._M_t.
       super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
       ._M_t.
       super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
       .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl._7_1_ & 1) ==
      0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string DecodeIds(const std::vector<int> &ids) const {
    DEFINE_SPP_DIRECT_FUNC_IMPL(Decode, std::string, ids);
  }